

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O3

void api_dynamic_suite::dynamic_last_segment(void)

{
  initializer_list<int> input;
  segment sVar1;
  int array [4];
  circular_view<int,_18446744073709551615UL> span;
  int local_40 [2];
  type local_38 [4];
  circular_view<int,_18446744073709551615UL> local_28;
  
  local_28.member.data = local_38;
  local_38[0] = 0;
  local_38[1] = 0;
  local_38[2] = 0;
  local_38[3] = 0;
  local_28.member.cap = 4;
  local_28.member.size = 0;
  local_28.member.next = 4;
  local_40[0] = 0xb;
  local_40[1] = 0x16;
  input._M_len = 2;
  input._M_array = local_40;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_28,input);
  sVar1 = vista::circular_view<int,_18446744073709551615UL>::last_segment(&local_28);
  boost::detail::
  test_all_eq_impl<std::ostream,int*,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x217,"void api_dynamic_suite::dynamic_last_segment()",sVar1.member.head,
             sVar1.member.tail,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)0x0,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)0x0);
  return;
}

Assistant:

void dynamic_last_segment()
{
    int array[4] = {};
    circular_view<int> span(array);
    span = { 11, 22 };
    auto segment = span.last_segment();
    {
        std::vector<int> expect = { };
        BOOST_TEST_ALL_EQ(segment.data(), segment.data() + segment.size(),
                          expect.begin(), expect.end());
    }
}